

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall
CVmObjVector::getp_last_val_which(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *buf;
  
  getp_last_index_which(this,self,retval,argc);
  if (retval->typ == VM_INT) {
    buf = (this->super_CVmObjCollection).super_CVmObject.ext_ + (long)(retval->val).intval * 5 + -1;
    retval->typ = (int)*buf;
    vmb_get_dh_val(buf,retval);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_last_val_which(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    /* get the index of the value using lastIndexWhich */
    getp_last_index_which(vmg_ self, retval, argc);

    /* if the return value is a valid index, get the value at the index */
    if (retval->typ == VM_INT)
    {
        int idx;
        
        /* get the element as the return value */
        idx = (int)retval->val.intval;
        get_element(idx - 1, retval);
    }

    /* handled */
    return TRUE;
}